

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int remarkupvals(global_State *g)

{
  lua_State *plVar1;
  UpVal *local_30;
  UpVal *uv;
  lua_State **pplStack_20;
  int work;
  lua_State **p;
  lua_State *thread;
  global_State *g_local;
  
  pplStack_20 = &g->twups;
  uv._4_4_ = 0;
  do {
    while( true ) {
      plVar1 = *pplStack_20;
      if (plVar1 == (lua_State *)0x0) {
        return uv._4_4_;
      }
      uv._4_4_ = uv._4_4_ + 1;
      if (((plVar1->marked & 0x18) != 0) || (plVar1->openupval == (UpVal *)0x0)) break;
      pplStack_20 = &plVar1->twups;
    }
    if ((1 < (plVar1->marked & 7)) && (plVar1->openupval != (UpVal *)0x0)) {
      __assert_fail("!(((thread)->marked & 7) > 1) || thread->openupval == ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1cf,"int remarkupvals(global_State *)");
    }
    *pplStack_20 = plVar1->twups;
    plVar1->twups = plVar1;
    for (local_30 = plVar1->openupval; local_30 != (UpVal *)0x0; local_30 = (local_30->u).open.next)
    {
      uv._4_4_ = uv._4_4_ + 1;
      if ((local_30->u).open.touched != 0) {
        if ((local_30->v->tt_ & 0x8000) != 0) {
          if ((local_30->v->tt_ & 0x8000) == 0) {
            __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x1d5,"int remarkupvals(global_State *)");
          }
          if ((local_30->v->tt_ & 0x7f) != (ushort)((local_30->v->value_).gc)->tt) {
LAB_00124f96:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x1d5,"int remarkupvals(global_State *)");
          }
          if (g->mainthread != (lua_State *)0x0) {
            if ((local_30->v->tt_ & 0x8000) == 0) {
              __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x1d5,"int remarkupvals(global_State *)");
            }
            if ((((local_30->v->value_).gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) !=
                0) goto LAB_00124f96;
          }
        }
        if ((local_30->v->tt_ & 0x8000) != 0) {
          if ((local_30->v->tt_ & 0x8000) == 0) {
            __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x1d5,"int remarkupvals(global_State *)");
          }
          if ((((local_30->v->value_).gc)->marked & 0x18) != 0) {
            if ((local_30->v->tt_ & 0x8000) == 0) {
              __assert_fail("(((uv->v)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                            ,0x1d5,"int remarkupvals(global_State *)");
            }
            reallymarkobject(g,(local_30->v->value_).gc);
          }
        }
        (local_30->u).open.touched = 0;
      }
    }
  } while( true );
}

Assistant:

static int remarkupvals (global_State *g) {
  lua_State *thread;
  lua_State **p = &g->twups;
  int work = 0;  /* estimate of how much work was done here */
  while ((thread = *p) != NULL) {
    work++;
    if (!iswhite(thread) && thread->openupval != NULL)
      p = &thread->twups;  /* keep marked thread with upvalues in the list */
    else {  /* thread is not marked or without upvalues */
      UpVal *uv;
      lua_assert(!isold(thread) || thread->openupval == NULL);
      *p = thread->twups;  /* remove thread from the list */
      thread->twups = thread;  /* mark that it is out of list */
      for (uv = thread->openupval; uv != NULL; uv = uv->u.open.next) {
        work++;
        if (uv->u.open.touched) {
          markvalue(g, uv->v);  /* remark upvalue's value */
          uv->u.open.touched = 0;
        }
      }
    }
  }
  return work;
}